

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

void __thiscall SQTable::Remove(SQTable *this,SQObjectPtr *key)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQTable *pSVar5;
  _HashNode *p_Var6;
  
  SVar3 = (key->super_SQObject)._type;
  if ((int)SVar3 < 0x5000004) {
    if ((SVar3 == OT_BOOL) || (SVar3 == OT_INTEGER)) {
      pSVar4 = (SQTable *)(key->super_SQObject)._unVal.nInteger;
      pSVar5 = pSVar4;
      goto LAB_0012bb76;
    }
  }
  else {
    if (SVar3 == OT_FLOAT) {
      pSVar5 = (SQTable *)(long)(key->super_SQObject)._unVal.fFloat;
      pSVar4 = (key->super_SQObject)._unVal.pTable;
      goto LAB_0012bb76;
    }
    if (SVar3 == OT_STRING) {
      pSVar4 = (SQTable *)(key->super_SQObject)._unVal.pString;
      pSVar5 = (pSVar4->super_SQDelegable)._delegate;
      goto LAB_0012bb76;
    }
  }
  pSVar4 = (SQTable *)(key->super_SQObject)._unVal.nInteger;
  pSVar5 = (SQTable *)((long)pSVar4 >> 3);
LAB_0012bb76:
  p_Var6 = this->_nodes + (this->_numofnodes - 1U & (ulong)pSVar5);
  while (((p_Var6->key).super_SQObject._unVal.pTable != pSVar4 ||
         ((p_Var6->key).super_SQObject._type != SVar3))) {
    p_Var6 = p_Var6->next;
    if (p_Var6 == (_HashNode *)0x0) {
      return;
    }
  }
  pSVar4 = (p_Var6->val).super_SQObject._unVal.pTable;
  SVar2 = (p_Var6->val).super_SQObject._type;
  (p_Var6->val).super_SQObject._type = OT_NULL;
  (p_Var6->val).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      SVar3 = (p_Var6->key).super_SQObject._type;
    }
  }
  pSVar4 = (p_Var6->key).super_SQObject._unVal.pTable;
  (p_Var6->key).super_SQObject._type = OT_NULL;
  (p_Var6->key).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_usednodes = this->_usednodes + -1;
  Rehash(this,false);
  return;
}

Assistant:

void SQTable::Remove(const SQObjectPtr &key)
{

    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        n->val.Null();
        n->key.Null();
        _usednodes--;
        Rehash(false);
    }
}